

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

int Fraig_NodeSimsContained(Fraig_Man_t *pMan,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)pMan->nWordsRand;
  if (pMan->nWordsRand < 1) {
    uVar3 = uVar4;
  }
  while (uVar3 != uVar4) {
    puVar1 = pNode2->puSimR + uVar4;
    puVar2 = pNode1->puSimR + uVar4;
    uVar4 = uVar4 + 1;
    if ((*puVar2 & ~*puVar1) != 0) {
      return 0;
    }
  }
  uVar3 = 0;
  uVar4 = (ulong)(uint)pMan->iWordStart;
  if (pMan->iWordStart < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    puVar1 = pNode2->puSimD + uVar3;
    puVar2 = pNode1->puSimD + uVar3;
    uVar3 = uVar3 + 1;
  } while ((*puVar2 & ~*puVar1) == 0);
  return 0;
}

Assistant:

int Fraig_NodeSimsContained( Fraig_Man_t * pMan, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2 )
{
    unsigned * pUnsigned1, * pUnsigned2;
    int i;

    // compare random siminfo
    pUnsigned1 = pNode1->puSimR;
    pUnsigned2 = pNode2->puSimR;
    for ( i = 0; i < pMan->nWordsRand; i++ )
        if ( pUnsigned1[i] & ~pUnsigned2[i] )
            return 0;

    // compare systematic siminfo
    pUnsigned1 = pNode1->puSimD;
    pUnsigned2 = pNode2->puSimD;
    for ( i = 0; i < pMan->iWordStart; i++ )
        if ( pUnsigned1[i] & ~pUnsigned2[i] )
            return 0;

    return 1;
}